

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

void __thiscall re2::Prog::Fanout(Prog *this,SparseArray<int> *fanout)

{
  int iVar1;
  Inst *pIVar2;
  bool bVar3;
  pointer pIVar4;
  ostream *poVar5;
  pointer pIVar6;
  int *piVar7;
  uint uVar8;
  SparseSet reachable;
  SparseSet local_1c8;
  LogMessageFatal local_1b0;
  
  if (fanout->max_size_ != this->size_) {
    __assert_fail("(fanout->max_size()) == (size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                  0x2e1,"void re2::Prog::Fanout(SparseArray<int> *)");
  }
  SparseSet::SparseSet(&local_1c8,fanout->max_size_);
  fanout->size_ = 0;
  SparseArray<int>::set_new(fanout,this->start_,0);
  pIVar4 = (fanout->dense_).
           super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar6 = pIVar4;
  do {
    if (pIVar6 == pIVar4 + fanout->size_) {
      SparseSet::~SparseSet(&local_1c8);
      return;
    }
    local_1c8.size_ = 0;
    SparseSet::insert(&local_1c8,pIVar6->index_);
    for (piVar7 = local_1c8.dense_; piVar7 != local_1c8.dense_ + local_1c8.size_;
        piVar7 = piVar7 + 1) {
      iVar1 = *piVar7;
      pIVar2 = this->inst_;
      uVar8 = pIVar2[iVar1].out_opcode_;
      switch(uVar8 & 7) {
      case 0:
        LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                   0x2ee);
        poVar5 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"unhandled ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pIVar2[iVar1].out_opcode_ & 7);
        std::operator<<(poVar5," in Prog::Fanout()");
        LogMessageFatal::~LogMessageFatal(&local_1b0);
        break;
      case 1:
        if ((uVar8 & 8) != 0) {
          __assert_fail("!ip->last()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                        ,0x2fc,"void re2::Prog::Fanout(SparseArray<int> *)");
        }
LAB_0012f43b:
        uVar8 = iVar1 + 1;
        goto LAB_0012f43f;
      case 2:
        if ((uVar8 & 8) == 0) {
          SparseSet::insert(&local_1c8,iVar1 + 1);
        }
        pIVar6->second = pIVar6->second + 1;
        bVar3 = SparseArray<int>::has_index(fanout,pIVar2[iVar1].out_opcode_ >> 4);
        if (!bVar3) {
          SparseArray<int>::set_new(fanout,pIVar2[iVar1].out_opcode_ >> 4,0);
        }
        break;
      default:
        if ((uVar8 & 8) == 0) {
          SparseSet::insert(&local_1c8,iVar1 + 1);
          uVar8 = pIVar2[iVar1].out_opcode_;
        }
        uVar8 = uVar8 >> 4;
LAB_0012f43f:
        SparseSet::insert(&local_1c8,uVar8);
        break;
      case 5:
        if ((uVar8 & 8) == 0) goto LAB_0012f43b;
        break;
      case 7:
        break;
      }
    }
    pIVar6 = pIVar6 + 1;
    pIVar4 = (fanout->dense_).
             super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
  } while( true );
}

Assistant:

void Prog::Fanout(SparseArray<int>* fanout) {
  DCHECK_EQ(fanout->max_size(), size());
  SparseSet reachable(size());
  fanout->clear();
  fanout->set_new(start(), 0);
  for (SparseArray<int>::iterator i = fanout->begin(); i != fanout->end(); ++i) {
    int* count = &i->second;
    reachable.clear();
    reachable.insert(i->index());
    for (SparseSet::iterator j = reachable.begin(); j != reachable.end(); ++j) {
      int id = *j;
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled " << ip->opcode() << " in Prog::Fanout()";
          break;

        case kInstByteRange:
          if (!ip->last())
            reachable.insert(id+1);

          (*count)++;
          if (!fanout->has_index(ip->out())) {
            fanout->set_new(ip->out(), 0);
          }
          break;

        case kInstAltMatch:
          DCHECK(!ip->last());
          reachable.insert(id+1);
          break;

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last())
            reachable.insert(id+1);

          reachable.insert(ip->out());
          break;

        case kInstMatch:
          if (!ip->last())
            reachable.insert(id+1);
          break;

        case kInstFail:
          break;
      }
    }
  }
}